

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorTests.cpp
# Opt level: O1

TestStatus *
vkt::FragmentOperations::anon_unknown_0::test
          (TestStatus *__return_storage_ptr__,Context *context,CaseDef *caseDef)

{
  TestPrimitive TVar1;
  TestLog *log;
  VkImageSubresourceRange subresourceRange;
  undefined1 auVar2 [8];
  undefined1 auVar3 [8];
  float fVar4;
  float fVar5;
  Context *pCVar6;
  TestStatus *pTVar7;
  bool bVar8;
  int i;
  int iVar9;
  float fVar10;
  deUint32 queueFamilyIndex;
  DeviceInterface *pDVar11;
  VkDevice pVVar12;
  Allocator *pAVar13;
  TextureFormat TVar14;
  const_iterator cVar15;
  long lVar16;
  int y;
  ulong uVar17;
  int x;
  int iVar18;
  VkDeviceSize VVar19;
  int iVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  Random rng;
  VertexData data;
  VkAttachmentDescription colorAttachmentDescription;
  ScissorRenderer renderer;
  Vec4 clearColor;
  VkAttachmentReference colorAttachmentRef;
  Vec4 scissorFullArea;
  undefined1 local_3f8 [16];
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  deUint32 local_3d8;
  VkSubpassDescription *local_3d0;
  deUint32 local_3c8;
  VkSubpassDependency *local_3c0;
  float local_3ac;
  undefined1 local_3a8 [8];
  undefined8 uStack_3a0;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined8 uStack_388;
  deUint32 dStack_380;
  deUint32 dStack_37c;
  VkSampleCountFlagBits VStack_378;
  VkImageTiling local_374;
  VkImageUsageFlags VStack_370;
  VkSharingMode VStack_36c;
  deUint32 dStack_368;
  undefined4 uStack_364;
  deUint32 *local_360;
  VkImageLayout local_358;
  undefined1 local_348 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  undefined4 local_328;
  TextureFormat local_318;
  TextureFormat local_310;
  Context *local_308;
  CaseDef *local_300;
  float local_2f4;
  ulong local_2f0;
  VkDeviceSize local_2e8;
  DeviceInterface *local_2e0;
  undefined1 local_2d8 [12];
  int iStack_2cc;
  float local_2c8;
  int local_2c4 [2];
  float local_2bc;
  undefined8 *local_2b8;
  undefined1 local_2b0 [40];
  float afStack_288 [2];
  deUint32 *local_280;
  float afStack_278 [2];
  vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
  local_270;
  VkDeviceSize local_258;
  VkPrimitiveTopology local_250;
  TextureFormat local_248;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_240;
  TextureFormat local_228;
  TextureFormat local_218;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_210;
  TextureFormat local_1f8;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_1f0;
  TextureFormat local_1d8;
  TextureFormat local_1c8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_1c0;
  TextureFormat local_1a8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_1a0;
  TextureFormat local_188;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_180;
  TextureFormat local_168;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_160;
  TextureFormat local_148;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_140;
  TextureFormat local_128;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_120;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  Move<vk::Handle<(vk::HandleType)17>_> local_e8;
  TestStatus *local_c8;
  VkDevice local_c0;
  TextureFormat local_b8;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_b0;
  TextureFormat local_98;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_90;
  undefined8 local_78;
  undefined8 uStack_70;
  deUint32 local_68;
  deUint32 *local_58;
  float afStack_50 [2];
  undefined8 local_48;
  Vec4 local_40;
  
  local_300 = caseDef;
  local_c8 = __return_storage_ptr__;
  pDVar11 = Context::getDeviceInterface(context);
  pVVar12 = Context::getDevice(context);
  local_308 = context;
  pAVar13 = Context::getDefaultAllocator(context);
  local_40.m_data[0] = 0.0;
  local_40.m_data[1] = 0.0;
  local_40.m_data[2] = 1.0;
  local_40.m_data[3] = 1.0;
  local_58 = (deUint32 *)0x3f0000003f000000;
  afStack_50[0] = 1.0;
  afStack_50[1] = 1.0;
  TVar14 = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar9 = tcu::getPixelSize(TVar14);
  VVar19 = (VkDeviceSize)(iVar9 << 0xe);
  makeBufferCreateInfo((VkBufferCreateInfo *)local_2b0,VVar19,2);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_3a8,pDVar11,pVVar12,
                     (VkBufferCreateInfo *)local_2b0,(VkAllocationCallbacks *)0x0);
  auVar2 = local_3a8;
  local_98.order = local_3a8._0_4_;
  local_98.type = local_3a8._4_4_;
  DStack_90.m_deviceIface = uStack_3a0;
  local_3a8._0_4_ = R;
  local_3a8._4_4_ = SNORM_INT8;
  uStack_3a0 = (DeviceInterface *)0x0;
  local_2e0 = pDVar11;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_2b0,pDVar11,
             pVVar12,pAVar13,(VkBuffer)auVar2,(MemoryRequirement)0x1);
  local_310.order = local_2b0._0_4_;
  local_310.type = local_2b0._4_4_;
  local_2e8 = VVar19;
  makeBufferCreateInfo((VkBufferCreateInfo *)local_2b0,VVar19,2);
  pDVar11 = local_2e0;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_3a8,local_2e0,pVVar12,
                     (VkBufferCreateInfo *)local_2b0,(VkAllocationCallbacks *)0x0);
  auVar2 = local_3a8;
  local_b8.order = local_3a8._0_4_;
  local_b8.type = local_3a8._4_4_;
  DStack_b0.m_deviceIface = uStack_3a0;
  local_3a8._0_4_ = R;
  local_3a8._4_4_ = SNORM_INT8;
  uStack_3a0 = (DeviceInterface *)0x0;
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_2b0,pDVar11,
             pVVar12,pAVar13,(VkBuffer)auVar2,(MemoryRequirement)0x1);
  VVar19 = local_2e8;
  TVar14 = local_310;
  local_318.order = local_2b0._0_4_;
  local_318.type = local_2b0._4_4_;
  memset(*(void **)((long)local_310 + 0x18),0,local_2e8);
  ::vk::flushMappedMemoryRange
            (pDVar11,pVVar12,(VkDeviceMemory)((VkDeviceMemory *)((long)TVar14 + 8))->m_internal,
             *(VkDeviceSize *)((long)TVar14 + 0x10),VVar19);
  TVar14 = local_318;
  memset(*(void **)((long)local_318 + 0x18),0,VVar19);
  ::vk::flushMappedMemoryRange
            (pDVar11,pVVar12,(VkDeviceMemory)((VkDeviceMemory *)((long)TVar14 + 8))->m_internal,
             *(VkDeviceSize *)((long)TVar14 + 0x10),VVar19);
  fVar25 = (local_300->renderArea).m_data[0];
  fVar26 = (local_300->renderArea).m_data[1];
  fVar23 = (local_300->renderArea).m_data[2];
  fVar24 = (local_300->renderArea).m_data[3];
  TVar1 = local_300->primitive;
  uVar17 = (ulong)TVar1;
  local_2b0._0_4_ = 0x80;
  local_2b0._4_4_ = 0x80;
  local_2b0._8_4_ = 5.1848e-44;
  local_2b0._12_4_ = 1;
  local_2b0._16_4_ = 0;
  local_2b0._20_4_ = 1;
  local_2b0._24_4_ = 0;
  local_2b0._28_4_ = 1;
  local_2b0._32_8_ = (void *)0x3f8000003f800000;
  afStack_288[0] = 1.0;
  afStack_288[1] = 1.0;
  local_280 = local_58;
  afStack_278[0] = afStack_50[0];
  afStack_278[1] = afStack_50[1];
  local_270.
  super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_270.
  super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_270.
  super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = pVVar12;
  deRandom_init((deRandom *)local_3f8,0x4d2);
  fVar5 = fStack_38c;
  fVar4 = fStack_390;
  fVar22 = fStack_394;
  fVar21 = local_398;
  local_2f0 = uVar17;
  if (TVar1 < (TEST_PRIMITIVE_BIG_TRIANGLE|TEST_PRIMITIVE_LINES)) {
    fVar25 = fVar25 + fVar25 + -1.0;
    fVar26 = fVar26 + fVar26 + -1.0;
    fVar23 = fVar23 + fVar23;
    fVar24 = fVar24 + fVar24;
    local_398 = (float)local_2b0._32_8_;
    fStack_394 = SUB84(local_2b0._32_8_,4);
    fStack_390 = afStack_288[0];
    fStack_38c = afStack_288[1];
    switch(uVar17) {
    case 0:
      iVar9 = 0x32;
      local_398 = fVar21;
      fStack_394 = fVar22;
      fStack_390 = fVar4;
      fStack_38c = fVar5;
      do {
        fVar21 = deRandom_getFloat((deRandom *)local_3f8);
        fVar22 = deRandom_getFloat((deRandom *)local_3f8);
        local_3a8._4_4_ = fVar22 * fVar24 + 0.0 + fVar26;
        local_3a8._0_4_ = fVar21 * fVar23 + 0.0 + fVar25;
        uStack_3a0 = (DeviceInterface *)0x3f80000000000000;
        local_398 = (float)local_2b0._32_8_;
        fStack_394 = SUB84(local_2b0._32_8_,4);
        fStack_390 = afStack_288[0];
        fStack_38c = afStack_288[1];
        std::
        vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
        ::push_back(&local_270,(value_type *)local_3a8);
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      break;
    case 1:
      fVar10 = 4.2039e-44;
      local_398 = fVar21;
      fStack_394 = fVar22;
      fStack_390 = fVar4;
      fStack_38c = fVar5;
      do {
        local_3ac = fVar10;
        fVar21 = deRandom_getFloat((deRandom *)local_3f8);
        fVar22 = deRandom_getFloat((deRandom *)local_3f8);
        fVar21 = fVar21 * (fVar23 + -0.2) + 0.0 + fVar25;
        local_2f4 = fVar22 * (fVar24 + -0.2) + 0.0 + fVar26;
        local_3a8._4_4_ = local_2f4;
        local_3a8._0_4_ = fVar21;
        uStack_3a0 = (DeviceInterface *)0x3f80000000000000;
        local_398 = (float)local_2b0._32_8_;
        fStack_394 = SUB84(local_2b0._32_8_,4);
        fStack_390 = afStack_288[0];
        fStack_38c = afStack_288[1];
        std::
        vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
        ::push_back(&local_270,(value_type *)local_3a8);
        local_3a8._4_4_ = local_2f4 + 0.2;
        local_3a8._0_4_ = fVar21 + 0.2;
        uStack_3a0 = (DeviceInterface *)0x3f80000000000000;
        local_398 = (float)local_2b0._32_8_;
        fStack_394 = SUB84(local_2b0._32_8_,4);
        fStack_390 = afStack_288[0];
        fStack_38c = afStack_288[1];
        std::
        vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
        ::push_back(&local_270,(value_type *)local_3a8);
        fVar10 = (float)((int)local_3ac + -1);
      } while (fVar10 != 0.0);
      break;
    case 2:
      iVar9 = 0x14;
      local_398 = fVar21;
      fStack_394 = fVar22;
      fStack_390 = fVar4;
      fStack_38c = fVar5;
      do {
        fVar21 = deRandom_getFloat((deRandom *)local_3f8);
        fVar22 = deRandom_getFloat((deRandom *)local_3f8);
        fVar21 = fVar21 * (fVar23 + -0.2) + 0.0 + fVar25;
        local_3ac = fVar22 * (fVar24 + -0.2) + 0.0 + fVar26;
        local_3a8._4_4_ = local_3ac;
        local_3a8._0_4_ = fVar21;
        uStack_3a0 = (DeviceInterface *)0x3f80000000000000;
        local_398 = (float)local_2b0._32_8_;
        fStack_394 = SUB84(local_2b0._32_8_,4);
        fStack_390 = afStack_288[0];
        fStack_38c = afStack_288[1];
        std::
        vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
        ::push_back(&local_270,(value_type *)local_3a8);
        local_3a8._4_4_ = local_3ac + 0.2;
        local_3a8._0_4_ = fVar21 + 0.1;
        uStack_3a0 = (DeviceInterface *)0x3f80000000000000;
        local_398 = (float)local_2b0._32_8_;
        fStack_394 = SUB84(local_2b0._32_8_,4);
        fStack_390 = afStack_288[0];
        fStack_38c = afStack_288[1];
        std::
        vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
        ::push_back(&local_270,(value_type *)local_3a8);
        local_3a8._4_4_ = local_3ac;
        local_3a8._0_4_ = fVar21 + 0.2;
        uStack_3a0 = (DeviceInterface *)0x3f80000000000000;
        local_398 = (float)local_2b0._32_8_;
        fStack_394 = SUB84(local_2b0._32_8_,4);
        fStack_390 = afStack_288[0];
        fStack_38c = afStack_288[1];
        std::
        vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
        ::push_back(&local_270,(value_type *)local_3a8);
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      break;
    case 3:
      local_3a8._4_4_ = fVar26;
      local_3a8._0_4_ = fVar25;
      uStack_3a0 = (DeviceInterface *)0x3f80000000000000;
      std::
      vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
      ::push_back(&local_270,(value_type *)local_3a8);
      local_3a8._4_4_ = fVar26 + fVar24;
      local_3a8._0_4_ = fVar25 + fVar23;
      uStack_3a0 = (DeviceInterface *)0x3f80000000000000;
      local_398 = (float)local_2b0._32_8_;
      fStack_394 = SUB84(local_2b0._32_8_,4);
      fStack_390 = afStack_288[0];
      fStack_38c = afStack_288[1];
      std::
      vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
      ::push_back(&local_270,(value_type *)local_3a8);
      break;
    case 4:
      local_3a8._4_4_ = fVar26;
      local_3a8._0_4_ = fVar25;
      uStack_3a0 = (DeviceInterface *)0x3f80000000000000;
      std::
      vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
      ::push_back(&local_270,(value_type *)local_3a8);
      local_3a8._4_4_ = fVar24 + fVar26;
      local_3a8._0_4_ = fVar23 * 0.5 + fVar25;
      uStack_3a0 = (DeviceInterface *)0x3f80000000000000;
      local_398 = (float)local_2b0._32_8_;
      fStack_394 = SUB84(local_2b0._32_8_,4);
      fStack_390 = afStack_288[0];
      fStack_38c = afStack_288[1];
      std::
      vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
      ::push_back(&local_270,(value_type *)local_3a8);
      local_3a8._4_4_ = fVar26;
      local_3a8._0_4_ = fVar25 + fVar23;
      uStack_3a0 = (DeviceInterface *)0x3f80000000000000;
      local_398 = (float)local_2b0._32_8_;
      fStack_394 = SUB84(local_2b0._32_8_,4);
      fStack_390 = afStack_288[0];
      fStack_38c = afStack_288[1];
      std::
      vector<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
      ::push_back(&local_270,(value_type *)local_3a8);
    }
  }
  local_258 = (long)local_270.
                    super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_270.
                    super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  local_250 = VK_PRIMITIVE_TOPOLOGY_LAST;
  if ((uint)local_2f0 < 5) {
    local_250 = *(VkPrimitiveTopology *)(&DAT_00b81fa4 + local_2f0 * 4);
  }
  local_248.order = R;
  local_248.type = SNORM_INT8;
  DStack_240.m_deviceIface = (DeviceInterface *)0x0;
  DStack_240.m_device = (VkDevice)0x0;
  DStack_240.m_allocator = (VkAllocationCallbacks *)0x0;
  local_228.order = R;
  local_228.type = SNORM_INT8;
  local_218.order = R;
  local_218.type = SNORM_INT8;
  DStack_210.m_deviceIface = (DeviceInterface *)0x0;
  DStack_210.m_device = (VkDevice)0x0;
  DStack_210.m_allocator = (VkAllocationCallbacks *)0x0;
  local_1f8.order = R;
  local_1f8.type = SNORM_INT8;
  DStack_1f0.m_deviceIface = (DeviceInterface *)0x0;
  DStack_1f0.m_device = (VkDevice)0x0;
  DStack_1f0.m_allocator = (VkAllocationCallbacks *)0x0;
  local_1d8.order = R;
  local_1d8.type = SNORM_INT8;
  memset(&local_1c8,0,0xe0);
  pCVar6 = local_308;
  pDVar11 = Context::getDeviceInterface(local_308);
  pVVar12 = Context::getDevice(pCVar6);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(pCVar6);
  pAVar13 = Context::getDefaultAllocator(pCVar6);
  local_3a8._0_4_ = sRGB;
  uStack_3a0 = (DeviceInterface *)0x0;
  local_398 = 0.0;
  fStack_394 = 1.4013e-45;
  fStack_390 = (float)local_2b0._8_4_;
  fStack_38c = (float)local_2b0._0_8_;
  uStack_388._0_4_ = SUB84(local_2b0._0_8_,4);
  uStack_388._4_4_ = VK_SHARING_MODE_CONCURRENT;
  dStack_380 = 1;
  dStack_37c = 1;
  VStack_378 = VK_SAMPLE_COUNT_1_BIT;
  local_374 = VK_IMAGE_TILING_OPTIMAL;
  VStack_370 = 0x11;
  VStack_36c = VK_SHARING_MODE_EXCLUSIVE;
  dStack_368 = 0;
  local_360 = (deUint32 *)0x0;
  local_358 = VK_IMAGE_LAYOUT_UNDEFINED;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)local_348,pDVar11,pVVar12,
                    (VkImageCreateInfo *)local_3a8,(VkAllocationCallbacks *)0x0);
  local_3e8 = (VkDevice)local_338._M_allocated_capacity;
  uStack_3e0 = local_338._8_8_;
  local_3f8._0_8_ = local_348._0_8_;
  local_3f8._8_8_ = local_348._8_8_;
  local_348._0_4_ = R;
  local_348._4_4_ = SNORM_INT8;
  local_348._8_8_ = (DeviceInterface *)0x0;
  local_338._M_allocated_capacity = 0;
  local_338._8_8_ = (VkAllocationCallbacks *)0x0;
  if (local_248 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&DStack_240,(VkImage)local_248);
  }
  DStack_240.m_device = local_3e8;
  DStack_240.m_allocator = (VkAllocationCallbacks *)uStack_3e0;
  local_248.order = local_3f8._0_4_;
  local_248.type = local_3f8._4_4_;
  DStack_240.m_deviceIface = (DeviceInterface *)local_3f8._8_8_;
  if ((TextureFormat)local_348._0_8_ != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)(local_348 + 8),(VkImage)local_348._0_8_);
  }
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_3a8,pDVar11,
            pVVar12,pAVar13,(VkImage)local_248,(MemoryRequirement)0x0);
  auVar2 = local_3a8;
  local_3a8._0_4_ = R;
  local_3a8._4_4_ = SNORM_INT8;
  if (local_228 != (TextureFormat)auVar2) {
    if (local_228 != (TextureFormat)0x0) {
      (**(code **)(*(long *)local_228 + 8))();
    }
    auVar3 = local_3a8;
    local_3a8._0_4_ = auVar2._0_4_;
    local_3a8._4_4_ = auVar2._4_4_;
    local_228.order = local_3a8._0_4_;
    local_228.type = local_3a8._4_4_;
    local_3a8 = auVar3;
  }
  if ((TextureFormat)local_3a8 != (TextureFormat)0x0) {
    (**(code **)(*(long *)local_3a8 + 8))();
    local_3a8._0_4_ = R;
    local_3a8._4_4_ = SNORM_INT8;
  }
  local_78 = CONCAT44(local_2b0._16_4_,local_2b0._12_4_);
  uStack_70 = CONCAT44(local_2b0._24_4_,local_2b0._20_4_);
  local_68 = local_2b0._28_4_;
  subresourceRange.baseMipLevel = local_2b0._16_4_;
  subresourceRange.aspectMask = local_2b0._12_4_;
  subresourceRange.levelCount = local_2b0._20_4_;
  subresourceRange.baseArrayLayer = local_2b0._24_4_;
  subresourceRange.layerCount = local_2b0._28_4_;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)local_3f8,pDVar11,pVVar12,
                (VkImage)local_248,VK_IMAGE_VIEW_TYPE_2D,local_2b0._8_4_,subresourceRange);
  local_398 = SUB84(local_3e8,0);
  fStack_394 = (float)((ulong)local_3e8 >> 0x20);
  fStack_390 = (float)uStack_3e0;
  fStack_38c = (float)(uStack_3e0 >> 0x20);
  local_3a8 = (undefined1  [8])local_3f8._0_8_;
  uStack_3a0 = (DeviceInterface *)local_3f8._8_8_;
  local_3f8._0_4_ = R;
  local_3f8._4_4_ = SNORM_INT8;
  local_3f8._8_8_ = (DeviceInterface *)0x0;
  local_3e8 = (VkDevice)0x0;
  uStack_3e0 = 0;
  if (local_218 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&DStack_210,(VkImageView)local_218);
  }
  DStack_210.m_device = (VkDevice)CONCAT44(fStack_394,local_398);
  DStack_210.m_allocator = (VkAllocationCallbacks *)CONCAT44(fStack_38c,fStack_390);
  local_218.order = local_3a8._0_4_;
  local_218.type = local_3a8._4_4_;
  DStack_210.m_deviceIface = uStack_3a0;
  if ((TextureFormat)local_3f8._0_8_ != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(local_3f8 + 8),
               (VkImageView)local_3f8._0_8_);
  }
  makeBufferCreateInfo((VkBufferCreateInfo *)local_3a8,local_258,0x80);
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)local_348,pDVar11,pVVar12,
                     (VkBufferCreateInfo *)local_3a8,(VkAllocationCallbacks *)0x0);
  local_3e8 = (VkDevice)local_338._M_allocated_capacity;
  uStack_3e0 = local_338._8_8_;
  local_3f8._0_8_ = local_348._0_8_;
  local_3f8._8_8_ = local_348._8_8_;
  local_348._0_8_ = (pointer)0x0;
  local_348._8_8_ = (DeviceInterface *)0x0;
  local_338._M_allocated_capacity = 0;
  local_338._8_8_ = (VkAllocationCallbacks *)0x0;
  if (local_1f8 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_1f0,(VkBuffer)local_1f8);
  }
  DStack_1f0.m_device = local_3e8;
  DStack_1f0.m_allocator = (VkAllocationCallbacks *)uStack_3e0;
  local_1f8.order = local_3f8._0_4_;
  local_1f8.type = local_3f8._4_4_;
  DStack_1f0.m_deviceIface = (DeviceInterface *)local_3f8._8_8_;
  if ((pointer)local_348._0_8_ != (pointer)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)(local_348 + 8),(VkBuffer)local_348._0_8_)
    ;
  }
  bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_3a8,pDVar11,
             pVVar12,pAVar13,(VkBuffer)local_1f8,(MemoryRequirement)0x1);
  auVar2 = local_3a8;
  local_3a8._0_4_ = R;
  local_3a8._4_4_ = SNORM_INT8;
  if (local_1d8 != (TextureFormat)auVar2) {
    if (local_1d8 != (TextureFormat)0x0) {
      (**(code **)(*(long *)local_1d8 + 8))();
    }
    auVar3 = local_3a8;
    local_3a8._0_4_ = auVar2._0_4_;
    local_3a8._4_4_ = auVar2._4_4_;
    local_1d8.order = local_3a8._0_4_;
    local_1d8.type = local_3a8._4_4_;
    local_3a8 = auVar3;
  }
  if ((TextureFormat)local_3a8 != (TextureFormat)0x0) {
    (**(code **)(*(long *)local_3a8 + 8))();
    local_3a8._0_4_ = R;
    local_3a8._4_4_ = SNORM_INT8;
  }
  memcpy(*(void **)((long)local_1d8 + 0x18),
         local_270.
         super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
         ._M_impl.super__Vector_impl_data._M_start,local_258);
  ::vk::flushMappedMemoryRange
            (pDVar11,pVVar12,(VkDeviceMemory)*(deUint64 *)((long)local_1d8 + 8),
             *(VkDeviceSize *)((long)local_1d8 + 0x10),local_258);
  local_348._8_8_ = (DeviceInterface *)0x4;
  local_338._M_allocated_capacity._0_5_ = 0x74726576;
  local_348._0_8_ = &local_338;
  cVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)local_308->m_progCollection,(key_type *)local_348);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_3f8,pDVar11,pVVar12,
             *(ProgramBinary **)(cVar15._M_node + 2),0);
  local_398 = SUB84(local_3e8,0);
  fStack_394 = (float)((ulong)local_3e8 >> 0x20);
  fStack_390 = (float)uStack_3e0;
  fStack_38c = (float)(uStack_3e0 >> 0x20);
  local_3a8 = (undefined1  [8])local_3f8._0_8_;
  uStack_3a0 = (DeviceInterface *)local_3f8._8_8_;
  local_3f8._0_4_ = R;
  local_3f8._4_4_ = SNORM_INT8;
  local_3f8._8_8_ = (DeviceInterface *)0x0;
  local_3e8 = (VkDevice)0x0;
  uStack_3e0 = 0;
  if (local_1c8 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&DStack_1c0,(VkShaderModule)local_1c8);
  }
  DStack_1c0.m_device = (VkDevice)CONCAT44(fStack_394,local_398);
  DStack_1c0.m_allocator = (VkAllocationCallbacks *)CONCAT44(fStack_38c,fStack_390);
  local_1c8.order = local_3a8._0_4_;
  local_1c8.type = local_3a8._4_4_;
  DStack_1c0.m_deviceIface = uStack_3a0;
  if ((TextureFormat)local_3f8._0_8_ != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)(local_3f8 + 8),
               (VkShaderModule)local_3f8._0_8_);
  }
  local_3e8 = (VkDevice)0x0;
  uStack_3e0 = 0;
  local_3f8._0_4_ = R;
  local_3f8._4_4_ = SNORM_INT8;
  local_3f8._8_8_ = (DeviceInterface *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._0_8_ != &local_338) {
    operator_delete((void *)local_348._0_8_,(ulong)(local_338._M_allocated_capacity + 1));
  }
  local_348._8_8_ = (DeviceInterface *)0x4;
  local_338._M_allocated_capacity._0_5_ = 0x67617266;
  local_348._0_8_ = &local_338;
  cVar15 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)local_308->m_progCollection,(key_type *)local_348);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_3f8,pDVar11,pVVar12,
             *(ProgramBinary **)(cVar15._M_node + 2),0);
  local_398 = SUB84(local_3e8,0);
  fStack_394 = (float)((ulong)local_3e8 >> 0x20);
  fStack_390 = (float)uStack_3e0;
  fStack_38c = (float)(uStack_3e0 >> 0x20);
  local_3a8 = (undefined1  [8])local_3f8._0_8_;
  uStack_3a0 = (DeviceInterface *)local_3f8._8_8_;
  local_3f8._0_4_ = R;
  local_3f8._4_4_ = SNORM_INT8;
  local_3f8._8_8_ = (DeviceInterface *)0x0;
  local_3e8 = (VkDevice)0x0;
  uStack_3e0 = 0;
  if (local_1a8 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&DStack_1a0,(VkShaderModule)local_1a8);
  }
  DStack_1a0.m_device = (VkDevice)CONCAT44(fStack_394,local_398);
  DStack_1a0.m_allocator = (VkAllocationCallbacks *)CONCAT44(fStack_38c,fStack_390);
  local_1a8.order = local_3a8._0_4_;
  local_1a8.type = local_3a8._4_4_;
  DStack_1a0.m_deviceIface = uStack_3a0;
  if ((TextureFormat)local_3f8._0_8_ != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)(local_3f8 + 8),
               (VkShaderModule)local_3f8._0_8_);
  }
  local_3e8 = (VkDevice)0x0;
  uStack_3e0 = 0;
  local_3f8._0_4_ = R;
  local_3f8._4_4_ = SNORM_INT8;
  local_3f8._8_8_ = (DeviceInterface *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._0_8_ != &local_338) {
    operator_delete((void *)local_348._0_8_,(ulong)(local_338._M_allocated_capacity + 1));
  }
  local_348._0_8_ = (ulong)(uint)local_2b0._8_4_ << 0x20;
  local_348._8_8_ = (DeviceInterface *)0x100000001;
  local_338._M_allocated_capacity = 0x200000000;
  local_338._8_8_ = &DAT_00000001;
  local_328 = 2;
  uStack_388 = &local_48;
  local_48 = 0x200000000;
  local_398 = 0.0;
  fStack_394 = 0.0;
  fStack_38c = 0.0;
  dStack_380 = 0;
  dStack_37c = 0;
  dStack_368 = 0;
  uStack_364 = 0;
  VStack_378 = 0;
  local_374 = VK_IMAGE_TILING_OPTIMAL;
  VStack_370 = 0;
  VStack_36c = VK_SHARING_MODE_EXCLUSIVE;
  local_3a8._0_4_ = R;
  local_3a8._4_4_ = SNORM_INT8;
  uStack_3a0 = (DeviceInterface *)0x0;
  fStack_390 = 1.4013e-45;
  local_3f8._0_4_ = 0x26;
  local_3f8._8_8_ = (DeviceInterface *)0x0;
  local_3e8 = (VkDevice)0x100000000;
  local_3d8 = 1;
  local_3c8 = 0;
  local_3c0 = (VkSubpassDependency *)0x0;
  uStack_3e0 = (deUint64)local_348;
  local_3d0 = (VkSubpassDescription *)local_3a8;
  ::vk::createRenderPass
            (&local_e8,pDVar11,pVVar12,(VkRenderPassCreateInfo *)local_3f8,
             (VkAllocationCallbacks *)0x0);
  local_398 = SUB84(local_e8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device,
                    0);
  fStack_394 = (float)((ulong)local_e8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter
                              .m_device >> 0x20);
  fStack_390 = SUB84(local_e8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
                     m_allocator,0);
  fStack_38c = (float)((ulong)local_e8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter
                              .m_allocator >> 0x20);
  local_3a8 = (undefined1  [8])
              local_e8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  uStack_3a0 = local_e8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_e8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  if (local_188 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&DStack_180,(VkRenderPass)local_188);
  }
  DStack_180.m_device = (VkDevice)CONCAT44(fStack_394,local_398);
  DStack_180.m_allocator = (VkAllocationCallbacks *)CONCAT44(fStack_38c,fStack_390);
  local_188.order = local_3a8._0_4_;
  local_188.type = local_3a8._4_4_;
  DStack_180.m_deviceIface = uStack_3a0;
  if (local_e8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&local_e8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               (VkRenderPass)
               local_e8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal);
  }
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)local_3f8,pDVar11,pVVar12,
                  (VkRenderPass)local_188,1,(VkImageView *)&local_218,local_2b0._0_4_,
                  local_2b0._4_4_,1);
  local_398 = SUB84(local_3e8,0);
  fStack_394 = (float)((ulong)local_3e8 >> 0x20);
  fStack_390 = (float)uStack_3e0;
  fStack_38c = (float)(uStack_3e0 >> 0x20);
  local_3a8 = (undefined1  [8])local_3f8._0_8_;
  uStack_3a0 = (DeviceInterface *)local_3f8._8_8_;
  local_3f8._0_4_ = R;
  local_3f8._4_4_ = SNORM_INT8;
  local_3f8._8_8_ = (DeviceInterface *)0x0;
  local_3e8 = (VkDevice)0x0;
  uStack_3e0 = 0;
  if (local_168 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&DStack_160,(VkFramebuffer)local_168);
  }
  DStack_160.m_device = (VkDevice)CONCAT44(fStack_394,local_398);
  DStack_160.m_allocator = (VkAllocationCallbacks *)CONCAT44(fStack_38c,fStack_390);
  local_168.order = local_3a8._0_4_;
  local_168.type = local_3a8._4_4_;
  DStack_160.m_deviceIface = uStack_3a0;
  if ((TextureFormat)local_3f8._0_8_ != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)(local_3f8 + 8),
               (VkFramebuffer)local_3f8._0_8_);
  }
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)local_3f8,pDVar11,pVVar12);
  local_398 = SUB84(local_3e8,0);
  fStack_394 = (float)((ulong)local_3e8 >> 0x20);
  fStack_390 = (float)uStack_3e0;
  fStack_38c = (float)(uStack_3e0 >> 0x20);
  local_3a8 = (undefined1  [8])local_3f8._0_8_;
  uStack_3a0 = (DeviceInterface *)local_3f8._8_8_;
  local_3f8._0_4_ = R;
  local_3f8._4_4_ = SNORM_INT8;
  local_3f8._8_8_ = (DeviceInterface *)0x0;
  local_3e8 = (VkDevice)0x0;
  uStack_3e0 = 0;
  if (local_148 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&DStack_140,(VkPipelineLayout)local_148);
  }
  DStack_140.m_device = (VkDevice)CONCAT44(fStack_394,local_398);
  DStack_140.m_allocator = (VkAllocationCallbacks *)CONCAT44(fStack_38c,fStack_390);
  local_148.order = local_3a8._0_4_;
  local_148.type = local_3a8._4_4_;
  DStack_140.m_deviceIface = uStack_3a0;
  if ((TextureFormat)local_3f8._0_8_ != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)(local_3f8 + 8),
               (VkPipelineLayout)local_3f8._0_8_);
  }
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)local_3f8,pDVar11,pVVar12,2,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  local_398 = SUB84(local_3e8,0);
  fStack_394 = (float)((ulong)local_3e8 >> 0x20);
  fStack_390 = (float)uStack_3e0;
  fStack_38c = (float)(uStack_3e0 >> 0x20);
  local_3a8 = (undefined1  [8])local_3f8._0_8_;
  uStack_3a0 = (DeviceInterface *)local_3f8._8_8_;
  local_3f8._0_4_ = R;
  local_3f8._4_4_ = SNORM_INT8;
  local_3f8._8_8_ = (DeviceInterface *)0x0;
  local_3e8 = (VkDevice)0x0;
  uStack_3e0 = 0;
  if (local_128 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&DStack_120,(VkCommandPool)local_128);
  }
  DStack_120.m_device = (VkDevice)CONCAT44(fStack_394,local_398);
  DStack_120.m_allocator = (VkAllocationCallbacks *)CONCAT44(fStack_38c,fStack_390);
  local_128.order = local_3a8._0_4_;
  local_128.type = local_3a8._4_4_;
  DStack_120.m_deviceIface = uStack_3a0;
  if ((TextureFormat)local_3f8._0_8_ != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)(local_3f8 + 8),
               (VkCommandPool)local_3f8._0_8_);
  }
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_3f8,pDVar11,pVVar12,(VkCommandPool)local_128,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  VVar19 = local_2e8;
  local_398 = (float)local_3e8;
  fStack_394 = local_3e8._4_4_;
  fStack_390 = (float)uStack_3e0;
  fStack_38c = uStack_3e0._4_4_;
  local_3a8 = (undefined1  [8])local_3f8._0_8_;
  uStack_3a0 = (DeviceInterface *)local_3f8._8_8_;
  local_3f8._0_4_ = R;
  local_3f8._4_4_ = SNORM_INT8;
  local_3f8._8_8_ = (DeviceInterface *)0x0;
  local_3e8 = (VkDevice)0x0;
  uStack_3e0 = 0;
  if ((pointer)CONCAT44(fStack_104,local_108) != (pointer)0x0) {
    local_348._0_8_ = (pointer)CONCAT44(fStack_104,local_108);
    (**(code **)(*(long *)CONCAT44(fStack_fc,fStack_100) + 0x240))
              ((long *)CONCAT44(fStack_fc,fStack_100),CONCAT44(fStack_f4,local_f8),
               CONCAT44(fStack_ec,fStack_f0),1);
  }
  local_f8 = local_398;
  fStack_f4 = fStack_394;
  fStack_f0 = fStack_390;
  fStack_ec = fStack_38c;
  local_108 = (float)local_3a8._0_4_;
  fStack_104 = (float)local_3a8._4_4_;
  fStack_100 = (float)uStack_3a0;
  fStack_fc = uStack_3a0._4_4_;
  if ((TextureFormat)local_3f8._0_8_ != (TextureFormat)0x0) {
    local_3a8 = (undefined1  [8])local_3f8._0_8_;
    (*(*(_func_int ***)local_3f8._8_8_)[0x48])(local_3f8._8_8_,local_3e8,uStack_3e0,1);
  }
  pCVar6 = local_308;
  ScissorRenderer::draw((ScissorRenderer *)local_2b0,local_308,&local_40,(VkBuffer)local_98);
  ScissorRenderer::draw
            ((ScissorRenderer *)local_2b0,pCVar6,&local_300->scissorArea,(VkBuffer)local_b8);
  ScissorRenderer::~ScissorRenderer((ScissorRenderer *)local_2b0);
  pVVar12 = local_c0;
  pDVar11 = local_2e0;
  ::vk::invalidateMappedMemoryRange
            (local_2e0,local_c0,
             (VkDeviceMemory)((VkDeviceMemory *)((long)local_310 + 8))->m_internal,0,VVar19);
  ::vk::invalidateMappedMemoryRange
            (pDVar11,pVVar12,(VkDeviceMemory)((VkDeviceMemory *)((long)local_318 + 8))->m_internal,0
             ,VVar19);
  local_3a8 = (undefined1  [8])::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_2b0,(TextureFormat *)local_3a8,0x80,0x80,1,
             *(void **)((long)local_318 + 0x18));
  local_3f8._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_3a8,(TextureFormat *)local_3f8,0x80,0x80,1,
             *(void **)((long)local_310 + 0x18));
  local_2d8._0_8_ = local_3a8;
  stack0xfffffffffffffd30 = uStack_3a0;
  pDVar11 = stack0xfffffffffffffd30;
  local_2c8 = local_398;
  local_2bc = fStack_38c;
  local_2c4[1] = (int)fStack_390;
  local_2c4[0] = (int)fStack_394;
  local_2b8 = uStack_388;
  iStack_2cc = (int)((ulong)uStack_3a0 >> 0x20);
  if (0 < iStack_2cc) {
    iVar9 = (int)uStack_3a0;
    fVar23 = (float)iStack_2cc;
    iVar18 = (int)((local_300->scissorArea).m_data[0] * (float)iVar9);
    iVar20 = (int)((local_300->scissorArea).m_data[1] * fVar23);
    fVar25 = (local_300->scissorArea).m_data[2];
    fVar26 = (local_300->scissorArea).m_data[3];
    y = 0;
    unique0x10002f0f = pDVar11;
    do {
      if (0 < (int)local_2d8._8_4_) {
        x = 0;
        do {
          if ((((x < iVar18) || ((int)((float)iVar9 * fVar25) + iVar18 <= x)) || (y < iVar20)) ||
             ((int)(fVar23 * fVar26) + iVar20 <= y)) {
            tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)local_2d8,(Vec4 *)&local_58,x,y,0)
            ;
          }
          x = x + 1;
        } while (x < (int)local_2d8._8_4_);
      }
      y = y + 1;
      pDVar11 = stack0xfffffffffffffd30;
    } while (y < iStack_2cc);
  }
  stack0xfffffffffffffd30 = pDVar11;
  log = local_308->m_testCtx->m_log;
  lVar16 = 0;
  do {
    *(undefined4 *)(local_3f8 + lVar16 * 4) = 0x3ca3d70a;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 4);
  bVar8 = tcu::floatThresholdCompare
                    (log,"color","Image compare",(ConstPixelBufferAccess *)local_3a8,
                     (ConstPixelBufferAccess *)local_2b0,(Vec4 *)local_3f8,COMPARE_LOG_RESULT);
  pTVar7 = local_c8;
  if (!bVar8) {
    local_3f8._0_8_ = &local_3e8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_3f8,"Rendered image is not correct","");
    pTVar7->m_code = QP_TEST_RESULT_FAIL;
    (pTVar7->m_description)._M_dataplus._M_p = (pointer)&(pTVar7->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar7->m_description,local_3f8._0_8_,
               (long)(_func_int ***)local_3f8._8_8_ + local_3f8._0_8_);
    if ((undefined8 *)local_3f8._0_8_ != &local_3e8) {
      operator_delete((void *)local_3f8._0_8_,(ulong)(local_3e8 + 1));
    }
    if (!bVar8) goto LAB_00816004;
  }
  local_2b0._0_8_ = (long)local_2b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"OK","");
  pTVar7->m_code = QP_TEST_RESULT_PASS;
  (pTVar7->m_description)._M_dataplus._M_p = (pointer)&(pTVar7->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar7->m_description,local_2b0._0_8_,
             (undefined1 *)(CONCAT44(local_2b0._12_4_,local_2b0._8_4_) + local_2b0._0_8_));
  if (local_2b0._0_8_ != (long)local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,CONCAT44(local_2b0._20_4_,local_2b0._16_4_) + 1);
  }
LAB_00816004:
  if (local_318 != (TextureFormat)0x0) {
    (**(code **)(*(long *)local_318 + 8))();
  }
  if (local_b8 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_b0,(VkBuffer)local_b8);
  }
  if (local_310 != (TextureFormat)0x0) {
    (**(code **)(*(long *)local_310 + 8))();
  }
  if (local_98 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              (&DStack_90,(VkBuffer)local_98);
  }
  return pTVar7;
}

Assistant:

tcu::TestStatus test (Context& context, const CaseDef caseDef)
{
	const DeviceInterface&			vk							= context.getDeviceInterface();
	const VkDevice					device						= context.getDevice();
	Allocator&						allocator					= context.getDefaultAllocator();

	const IVec2						renderSize					(128, 128);
	const VkFormat					colorFormat					= VK_FORMAT_R8G8B8A8_UNORM;
	const Vec4						scissorFullArea				(0.0f, 0.0f, 1.0f, 1.0f);
	const Vec4						primitiveColor				(1.0f, 1.0f, 1.0f, 1.0f);
	const Vec4						clearColor					(0.5f, 0.5f, 1.0f, 1.0f);

	const VkDeviceSize				colorBufferSize				= renderSize.x() * renderSize.y() * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Unique<VkBuffer>			colorBufferFull				(makeBuffer(vk, device, makeBufferCreateInfo(colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT)));
	const UniquePtr<Allocation>		colorBufferFullAlloc		(bindBuffer(vk, device, allocator, *colorBufferFull, MemoryRequirement::HostVisible));

	const Unique<VkBuffer>			colorBufferScissored		(makeBuffer(vk, device, makeBufferCreateInfo(colorBufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT)));
	const UniquePtr<Allocation>		colorBufferScissoredAlloc	(bindBuffer(vk, device, allocator, *colorBufferScissored, MemoryRequirement::HostVisible));

	zeroBuffer(vk, device, *colorBufferFullAlloc, colorBufferSize);
	zeroBuffer(vk, device, *colorBufferScissoredAlloc, colorBufferSize);

	// Draw
	{
		const ScissorRenderer renderer (context, caseDef, renderSize, colorFormat, primitiveColor, clearColor);

		renderer.draw(context, scissorFullArea, *colorBufferFull);
		renderer.draw(context, caseDef.scissorArea, *colorBufferScissored);
	}

	// Log image
	{
		invalidateMappedMemoryRange(vk, device, colorBufferFullAlloc->getMemory(), 0ull, colorBufferSize);
		invalidateMappedMemoryRange(vk, device, colorBufferScissoredAlloc->getMemory(), 0ull, colorBufferSize);

		const tcu::ConstPixelBufferAccess	resultImage		(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1u, colorBufferScissoredAlloc->getHostPtr());
		tcu::PixelBufferAccess				referenceImage	(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), 1u, colorBufferFullAlloc->getHostPtr());

		// Apply scissor to the full image, so we can compare it with the result image.
		applyScissor (referenceImage, caseDef.scissorArea, clearColor);

		// Images should now match.
		if (!tcu::floatThresholdCompare(context.getTestContext().getLog(), "color", "Image compare", referenceImage, resultImage, Vec4(0.02f), tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Rendered image is not correct");
	}

	return tcu::TestStatus::pass("OK");
}